

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

tc_toktyp_t
CTcTokenizer::next_on_line
          (CTcTokString *srcbuf,utf8_ptr *p,CTcToken *tok,tok_embed_ctx *ec,int expanding)

{
  CTcToken *this;
  tc_toktyp_t tVar1;
  char *pcVar2;
  char *pcVar3;
  void *in_RCX;
  CTcToken *in_RDX;
  undefined8 in_RSI;
  int expanding_00;
  tok_embed_ctx *in_RDI;
  CTcToken *unaff_retaddr;
  utf8_ptr *in_stack_00000008;
  tok_embed_ctx oldec;
  undefined1 local_d8 [184];
  void *local_20;
  CTcToken *local_18;
  
  expanding_00 = (int)((ulong)in_RSI >> 0x20);
  local_20 = in_RCX;
  local_18 = in_RDX;
  memcpy(local_d8,in_RCX,0xb0);
  next_on_line(in_stack_00000008,unaff_retaddr,in_RDI,expanding_00);
  pcVar2 = CTcToken::get_text(local_18);
  pcVar3 = CTcTokString::get_text_end((CTcTokString *)in_RDI);
  if (pcVar3 <= pcVar2) {
    CTcToken::settyp(local_18,TOKT_EOF);
    this = local_18;
    pcVar2 = CTcTokString::get_text_end((CTcTokString *)in_RDI);
    CTcToken::set_text(this,pcVar2,0);
    memcpy(local_20,local_d8,0xb0);
  }
  tVar1 = CTcToken::gettyp(local_18);
  return tVar1;
}

Assistant:

tc_toktyp_t CTcTokenizer::next_on_line(const CTcTokString *srcbuf,
                                       utf8_ptr *p, CTcToken *tok,
                                       tok_embed_ctx *ec, int expanding)
{
    /* 
     *   save the embedding context, in case the next token isn't part of the
     *   narrowed section of the buffer we're scanning 
     */
    tok_embed_ctx oldec = *ec;

    /* get the next token */
    next_on_line(p, tok, ec, expanding);
    
    /* if the token is past the end of the line, return EOF */
    if (tok->get_text() >= srcbuf->get_text_end())
    {
        /* set the token to indicate end of line */
        tok->settyp(TOKT_EOF);

        /* set the token to point to the end of the buffer */
        tok->set_text(srcbuf->get_text_end(), 0);

        /* restore the embedding context */
        *ec = oldec;
    }
    
    /* return the token type */
    return tok->gettyp();
}